

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O3

void statemachine_definition_populate
               (statemachine_definition *def,int **transition_table,char **state_names)

{
  if (def == (statemachine_definition *)0x0) {
    __assert_fail("def != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O3/src/tests/statemachine.c"
                  ,0x3e,
                  "void statemachine_definition_populate(statemachine_definition *, const int *const *, const char *const *)"
                 );
  }
  if (transition_table != (int **)0x0) {
    def->transition_table = transition_table;
    def->state_names = state_names;
    return;
  }
  __assert_fail("transition_table != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/build_O3/src/tests/statemachine.c"
                ,0x3f,
                "void statemachine_definition_populate(statemachine_definition *, const int *const *, const char *const *)"
               );
}

Assistant:

void statemachine_definition_populate(statemachine_definition *def,
                                      const int* const* transition_table,
                                      const char* const* state_names)
{
  assert(def != NULL);
  assert(transition_table != NULL);

  def->transition_table = transition_table;

  def->state_names = state_names;
}